

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int ssl_check_ctr_renegotiate(mbedtls_ssl_context *ssl)

{
  int iVar1;
  uchar *__s2;
  
  if (((ssl->state == 0x10) && (ssl->renego_status != 3)) && ((ssl->conf->field_0x165 & 0x40) != 0))
  {
    __s2 = ssl->conf->renego_period;
    iVar1 = memcmp(ssl->in_ctr,__s2,8);
    if ((iVar1 < 1) && (iVar1 = memcmp(ssl->out_ctr,__s2,8), iVar1 < 1)) {
      return 0;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x18ce,"record counter limit reached: renegotiate");
    iVar1 = mbedtls_ssl_renegotiate(ssl);
    return iVar1;
  }
  return 0;
}

Assistant:

static int ssl_check_ctr_renegotiate( mbedtls_ssl_context *ssl )
{
    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER ||
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING ||
        ssl->conf->disable_renegotiation == MBEDTLS_SSL_RENEGOTIATION_DISABLED )
    {
        return( 0 );
    }

    if( memcmp( ssl->in_ctr,  ssl->conf->renego_period, 8 ) <= 0 &&
        memcmp( ssl->out_ctr, ssl->conf->renego_period, 8 ) <= 0 )
    {
        return( 0 );
    }

    MBEDTLS_SSL_DEBUG_MSG( 1, ( "record counter limit reached: renegotiate" ) );
    return( mbedtls_ssl_renegotiate( ssl ) );
}